

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

void __thiscall duckdb::JoinRef::Serialize(JoinRef *this,Serializer *serializer)

{
  TableRef::Serialize(&this->super_TableRef,serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (serializer,200,"left",&this->left);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (serializer,0xc9,"right",&this->right);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (serializer,0xca,"condition",&this->condition);
  Serializer::WriteProperty<duckdb::JoinType>(serializer,0xcb,"join_type",&this->type);
  Serializer::WriteProperty<duckdb::JoinRefType>(serializer,0xcc,"ref_type",&this->ref_type);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xcd,"using_columns",&this->using_columns);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xce,"delim_flipped",&this->delim_flipped);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,0xcf,"duplicate_eliminated_columns",&this->duplicate_eliminated_columns);
  return;
}

Assistant:

void JoinRef::Serialize(Serializer &serializer) const {
	TableRef::Serialize(serializer);
	serializer.WritePropertyWithDefault<unique_ptr<TableRef>>(200, "left", left);
	serializer.WritePropertyWithDefault<unique_ptr<TableRef>>(201, "right", right);
	serializer.WritePropertyWithDefault<unique_ptr<ParsedExpression>>(202, "condition", condition);
	serializer.WriteProperty<JoinType>(203, "join_type", type);
	serializer.WriteProperty<JoinRefType>(204, "ref_type", ref_type);
	serializer.WritePropertyWithDefault<vector<string>>(205, "using_columns", using_columns);
	serializer.WritePropertyWithDefault<bool>(206, "delim_flipped", delim_flipped);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(207, "duplicate_eliminated_columns", duplicate_eliminated_columns);
}